

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::V1LayerParameter::SerializeWithCachedSizes(V1LayerParameter *this,CodedOutputStream *output)

{
  int iVar1;
  int iVar2;
  V1LayerParameter_LayerType value;
  uint uVar3;
  uint uVar4;
  V1LayerParameter_DimCheckMode value_00;
  char *pcVar5;
  string *psVar6;
  BlobProto *value_01;
  NetStateRule *pNVar7;
  UnknownFieldSet *unknown_fields;
  float fVar8;
  int local_a8;
  int n_9;
  int i_9;
  int n_8;
  int i_8;
  int n_7;
  int i_7;
  uint n_6;
  uint i_6;
  uint n_5;
  uint i_5;
  int n_4;
  int i_4;
  int n_3;
  int i_3;
  uint n_2;
  uint i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  V1LayerParameter *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (1,(MessageLite *)this->layer_,output);
  }
  i_1 = 0;
  iVar1 = bottom_size(this);
  for (; i_1 < iVar1; i_1 = i_1 + 1) {
    bottom_abi_cxx11_(this,i_1);
    pcVar5 = (char *)std::__cxx11::string::data();
    bottom_abi_cxx11_(this,i_1);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.bottom");
    psVar6 = bottom_abi_cxx11_(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteString(2,psVar6,output);
  }
  i_2 = 0;
  iVar1 = top_size(this);
  for (; (int)i_2 < iVar1; i_2 = i_2 + 1) {
    top_abi_cxx11_(this,i_2);
    pcVar5 = (char *)std::__cxx11::string::data();
    top_abi_cxx11_(this,i_2);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.top");
    psVar6 = top_abi_cxx11_(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteString(3,psVar6,output);
  }
  if ((uVar3 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar1,SERIALIZE,"caffe.V1LayerParameter.name");
    psVar6 = name_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(4,psVar6,output);
  }
  if (((this->_has_bits_).has_bits_[1] & 1) != 0) {
    value = type(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(5,value,output);
  }
  i_3 = 0;
  uVar3 = blobs_size(this);
  for (; (uint)i_3 < uVar3; i_3 = i_3 + 1) {
    value_01 = blobs(this,i_3);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (6,(MessageLite *)value_01,output);
  }
  i_4 = 0;
  iVar1 = blobs_lr_size(this);
  for (; i_4 < iVar1; i_4 = i_4 + 1) {
    fVar8 = blobs_lr(this,i_4);
    google::protobuf::internal::WireFormatLite::WriteFloat(7,fVar8,output);
  }
  i_5 = 0;
  iVar1 = weight_decay_size(this);
  for (; (int)i_5 < iVar1; i_5 = i_5 + 1) {
    fVar8 = weight_decay(this,i_5);
    google::protobuf::internal::WireFormatLite::WriteFloat(8,fVar8,output);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (9,(MessageLite *)this->concat_param_,output);
  }
  if ((uVar3 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (10,(MessageLite *)this->convolution_param_,output);
  }
  if ((uVar3 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0xb,(MessageLite *)this->data_param_,output);
  }
  if ((uVar3 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0xc,(MessageLite *)this->dropout_param_,output);
  }
  if ((uVar3 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0xd,(MessageLite *)this->hdf5_data_param_,output);
  }
  if ((uVar3 & 0x80) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0xe,(MessageLite *)this->hdf5_output_param_,output);
  }
  if ((uVar3 & 0x100) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0xf,(MessageLite *)this->image_data_param_,output);
  }
  if ((uVar3 & 0x200) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x10,(MessageLite *)this->infogain_loss_param_,output);
  }
  if ((uVar3 & 0x400) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x11,(MessageLite *)this->inner_product_param_,output);
  }
  if ((uVar3 & 0x800) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x12,(MessageLite *)this->lrn_param_,output);
  }
  if ((uVar3 & 0x1000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x13,(MessageLite *)this->pooling_param_,output);
  }
  if ((uVar3 & 0x2000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x14,(MessageLite *)this->window_data_param_,output);
  }
  if ((uVar3 & 0x4000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x15,(MessageLite *)this->power_param_,output);
  }
  if ((uVar3 & 0x8000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x16,(MessageLite *)this->memory_data_param_,output);
  }
  if ((uVar3 & 0x10000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x17,(MessageLite *)this->argmax_param_,output);
  }
  if ((uVar3 & 0x20000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x18,(MessageLite *)this->eltwise_param_,output);
  }
  if ((uVar3 & 0x40000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x19,(MessageLite *)this->threshold_param_,output);
  }
  if ((uVar3 & 0x80000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1a,(MessageLite *)this->dummy_data_param_,output);
  }
  if ((uVar3 & 0x100000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1b,(MessageLite *)this->accuracy_param_,output);
  }
  if ((uVar3 & 0x200000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1d,(MessageLite *)this->hinge_loss_param_,output);
  }
  if ((uVar3 & 0x400000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1e,(MessageLite *)this->relu_param_,output);
  }
  if ((uVar3 & 0x800000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1f,(MessageLite *)this->slice_param_,output);
  }
  i_6 = 0;
  uVar4 = include_size(this);
  for (; i_6 < uVar4; i_6 = i_6 + 1) {
    pNVar7 = include(this,i_6);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x20,(MessageLite *)pNVar7,output);
  }
  i_7 = 0;
  uVar4 = exclude_size(this);
  for (; (uint)i_7 < uVar4; i_7 = i_7 + 1) {
    pNVar7 = exclude(this,i_7);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x21,(MessageLite *)pNVar7,output);
  }
  if ((uVar3 & 0x1000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x22,(MessageLite *)this->mvn_param_,output);
  }
  i_8 = 0;
  iVar1 = loss_weight_size(this);
  for (; i_8 < iVar1; i_8 = i_8 + 1) {
    fVar8 = loss_weight(this,i_8);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x23,fVar8,output);
  }
  if ((uVar3 & 0x2000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x24,(MessageLite *)this->transform_param_,output);
  }
  if ((uVar3 & 0x4000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x25,(MessageLite *)this->tanh_param_,output);
  }
  if ((uVar3 & 0x8000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x26,(MessageLite *)this->sigmoid_param_,output);
  }
  if ((uVar3 & 0x10000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x27,(MessageLite *)this->softmax_param_,output);
  }
  if ((uVar3 & 0x20000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x28,(MessageLite *)this->contrastive_loss_param_,output);
  }
  if ((uVar3 & 0x40000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x29,(MessageLite *)this->exp_param_,output);
  }
  if ((uVar3 & 0x80000000) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x2a,(MessageLite *)this->loss_param_,output);
  }
  i_9 = 0;
  iVar1 = param_size(this);
  for (; i_9 < iVar1; i_9 = i_9 + 1) {
    param_abi_cxx11_(this,i_9);
    pcVar5 = (char *)std::__cxx11::string::data();
    param_abi_cxx11_(this,i_9);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"caffe.V1LayerParameter.param");
    psVar6 = param_abi_cxx11_(this,i_9);
    google::protobuf::internal::WireFormatLite::WriteString(0x3e9,psVar6,output);
  }
  local_a8 = 0;
  iVar1 = blob_share_mode_size(this);
  for (; local_a8 < iVar1; local_a8 = local_a8 + 1) {
    value_00 = blob_share_mode(this,local_a8);
    google::protobuf::internal::WireFormatLite::WriteEnum(0x3ea,value_00,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = V1LayerParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void V1LayerParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.V1LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.V0LayerParameter layer = 1;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, *this->layer_, output);
  }

  // repeated string bottom = 2;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.bottom");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->bottom(i), output);
  }

  // repeated string top = 3;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.top");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->top(i), output);
  }

  // optional string name = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->name(), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.V1LayerParameter.LayerType type = 5;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->type(), output);
  }

  // repeated .caffe.BlobProto blobs = 6;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->blobs(i), output);
  }

  // repeated float blobs_lr = 7;
  for (int i = 0, n = this->blobs_lr_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      7, this->blobs_lr(i), output);
  }

  // repeated float weight_decay = 8;
  for (int i = 0, n = this->weight_decay_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      8, this->weight_decay(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ConcatParameter concat_param = 9;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, *this->concat_param_, output);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 10;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      10, *this->convolution_param_, output);
  }

  // optional .caffe.DataParameter data_param = 11;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      11, *this->data_param_, output);
  }

  // optional .caffe.DropoutParameter dropout_param = 12;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      12, *this->dropout_param_, output);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 13;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      13, *this->hdf5_data_param_, output);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 14;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      14, *this->hdf5_output_param_, output);
  }

  // optional .caffe.ImageDataParameter image_data_param = 15;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, *this->image_data_param_, output);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 16;
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      16, *this->infogain_loss_param_, output);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 17;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      17, *this->inner_product_param_, output);
  }

  // optional .caffe.LRNParameter lrn_param = 18;
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      18, *this->lrn_param_, output);
  }

  // optional .caffe.PoolingParameter pooling_param = 19;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      19, *this->pooling_param_, output);
  }

  // optional .caffe.WindowDataParameter window_data_param = 20;
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      20, *this->window_data_param_, output);
  }

  // optional .caffe.PowerParameter power_param = 21;
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      21, *this->power_param_, output);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 22;
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      22, *this->memory_data_param_, output);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 23;
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      23, *this->argmax_param_, output);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 24;
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      24, *this->eltwise_param_, output);
  }

  // optional .caffe.ThresholdParameter threshold_param = 25;
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      25, *this->threshold_param_, output);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 26;
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      26, *this->dummy_data_param_, output);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 27;
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      27, *this->accuracy_param_, output);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 29;
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      29, *this->hinge_loss_param_, output);
  }

  // optional .caffe.ReLUParameter relu_param = 30;
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      30, *this->relu_param_, output);
  }

  // optional .caffe.SliceParameter slice_param = 31;
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      31, *this->slice_param_, output);
  }

  // repeated .caffe.NetStateRule include = 32;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      32, this->include(i), output);
  }

  // repeated .caffe.NetStateRule exclude = 33;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      33, this->exclude(i), output);
  }

  // optional .caffe.MVNParameter mvn_param = 34;
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      34, *this->mvn_param_, output);
  }

  // repeated float loss_weight = 35;
  for (int i = 0, n = this->loss_weight_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      35, this->loss_weight(i), output);
  }

  // optional .caffe.TransformationParameter transform_param = 36;
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      36, *this->transform_param_, output);
  }

  // optional .caffe.TanHParameter tanh_param = 37;
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      37, *this->tanh_param_, output);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 38;
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      38, *this->sigmoid_param_, output);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 39;
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      39, *this->softmax_param_, output);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 40;
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      40, *this->contrastive_loss_param_, output);
  }

  // optional .caffe.ExpParameter exp_param = 41;
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      41, *this->exp_param_, output);
  }

  // optional .caffe.LossParameter loss_param = 42;
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      42, *this->loss_param_, output);
  }

  // repeated string param = 1001;
  for (int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->param(i).data(), this->param(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.param");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1001, this->param(i), output);
  }

  // repeated .caffe.V1LayerParameter.DimCheckMode blob_share_mode = 1002;
  for (int i = 0, n = this->blob_share_mode_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1002, this->blob_share_mode(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.V1LayerParameter)
}